

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BackwardPass.cpp
# Opt level: O1

void __thiscall BackwardPass::MarkScopeObjSymUseForStackArgOpt(BackwardPass *this)

{
  Instr *this_00;
  BasicBlock *this_01;
  BVSparse<Memory::JitArenaAllocator> *this_02;
  bool bVar1;
  StackSym *pSVar2;
  
  if (this->tag == DeadStorePhase) {
    this_00 = this->currentInstr;
    this_01 = this->currentBlock;
    bVar1 = IR::Instr::DoStackArgsOpt(this_00);
    if (bVar1) {
      bVar1 = BasicBlock::IsLandingPad(this_01);
      if (!bVar1) {
        pSVar2 = Func::GetScopeObjSym(this_00->m_func);
        if (pSVar2 != (StackSym *)0x0) {
          bVar1 = DoByteCodeUpwardExposedUsed(this);
          if (bVar1) {
            this_02 = this->currentBlock->byteCodeUpwardExposedUsed;
            pSVar2 = Func::GetScopeObjSym(this_00->m_func);
            BVSparse<Memory::JitArenaAllocator>::Set(this_02,(pSVar2->super_Sym).m_id);
            return;
          }
        }
      }
    }
  }
  return;
}

Assistant:

void
BackwardPass::MarkScopeObjSymUseForStackArgOpt()
{
    IR::Instr * instr = this->currentInstr;
    BasicBlock *block = this->currentBlock;

    if (tag == Js::DeadStorePhase)
    {
        if (instr->DoStackArgsOpt() && !block->IsLandingPad() && instr->m_func->GetScopeObjSym() != nullptr && this->DoByteCodeUpwardExposedUsed())
        {
            this->currentBlock->byteCodeUpwardExposedUsed->Set(instr->m_func->GetScopeObjSym()->m_id);
        }
    }
}